

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

UINT GetTempFileNameA(LPCSTR lpPathName,LPCSTR lpPrefixString,UINT uUnique,LPSTR lpTempFileName)

{
  long lVar1;
  bool bVar2;
  USHORT UVar3;
  int iVar4;
  DWORD DVar5;
  DWORD DVar6;
  BOOL BVar7;
  errno_t eVar8;
  time_t tVar9;
  size_t sVar10;
  char *_Dst;
  SIZE_T SVar11;
  char *string;
  long in_FS_OFFSET;
  uint local_17c;
  ushort local_f2;
  UINT UStack_ec;
  USHORT uLoopCounter;
  DWORD dwError;
  UINT uRet;
  HANDLE hTempFile;
  CHAR chLastPathNameChar;
  CHAR *file_template;
  int length;
  CHAR *full_name;
  CPalThread *pThread;
  LPSTR lpTempFileName_local;
  UINT uUnique_local;
  LPCSTR lpPrefixString_local;
  LPCSTR lpPathName_local;
  PathCharString file_templatePS;
  PathCharString full_namePS;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  StackString<32UL,_char>::StackString((StackString<32UL,_char> *)&file_templatePS.m_count);
  StackString<32UL,_char>::StackString((StackString<32UL,_char> *)&lpPathName_local);
  UStack_ec = 0;
  local_f2 = 0;
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  CorUnix::InternalGetCurrentThread();
  if (IsInitialized == 0) {
    tVar9 = time((time_t *)0x0);
    uUniqueSeed = (USHORT)tVar9;
    if (uUniqueSeed == 0) {
      uUniqueSeed = 1;
    }
    IsInitialized = 1;
  }
  if ((lpPathName == (LPCSTR)0x0) || (*lpPathName == '\0')) {
    CorUnix::CPalThread::SetLastError(0x10b);
  }
  else if (lpTempFileName == (LPSTR)0x0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    CorUnix::CPalThread::SetLastError(0x57);
  }
  else {
    sVar10 = strlen(lpPathName);
    if (sVar10 + 0xb < 0x400) {
      sVar10 = strlen(lpPathName);
      iVar4 = (int)sVar10 + 0x15;
      _Dst = StackString<32UL,_char>::OpenStringBuffer
                       ((StackString<32UL,_char> *)&lpPathName_local,(long)iVar4);
      if (_Dst == (char *)0x0) {
        CorUnix::CPalThread::SetLastError(8);
      }
      else {
        *_Dst = '\0';
        SVar11 = StackString<32UL,_char>::GetSizeOf((StackString<32UL,_char> *)&lpPathName_local);
        strcat_s(_Dst,SVar11,lpPathName);
        StackString<32UL,_char>::CloseBuffer
                  ((StackString<32UL,_char> *)&lpPathName_local,(long)iVar4);
        sVar10 = strlen(_Dst);
        if ((_Dst[sVar10 - 1] != '\\') && (_Dst[sVar10 - 1] != '/')) {
          SVar11 = StackString<32UL,_char>::GetSizeOf((StackString<32UL,_char> *)&lpPathName_local);
          strcat_s(_Dst,SVar11,"\\");
        }
        if (lpPrefixString != (LPCSTR)0x0) {
          SVar11 = StackString<32UL,_char>::GetSizeOf((StackString<32UL,_char> *)&lpPathName_local);
          strncat_s(_Dst,SVar11,lpPrefixString,3);
        }
        FILEDosToUnixPathA(_Dst);
        SVar11 = StackString<32UL,_char>::GetSizeOf((StackString<32UL,_char> *)&lpPathName_local);
        strncat_s(_Dst,SVar11,"%.4x.TMP",8);
        DVar5 = GetLastError();
        CorUnix::CPalThread::SetLastError(0);
        sVar10 = strlen(_Dst);
        iVar4 = (int)sVar10 + 0xb;
        string = StackString<32UL,_char>::OpenStringBuffer
                           ((StackString<32UL,_char> *)&file_templatePS.m_count,(long)iVar4);
        if (string == (char *)0x0) {
          CorUnix::CPalThread::SetLastError(8);
        }
        else {
          SVar11 = StackString<32UL,_char>::GetSizeOf
                             ((StackString<32UL,_char> *)&file_templatePS.m_count);
          local_17c = uUnique;
          if (uUnique == 0) {
            local_17c = (uint)uUniqueSeed;
          }
          sprintf_s(string,SVar11,_Dst,(ulong)local_17c);
          StackString<32UL,_char>::CloseBuffer
                    ((StackString<32UL,_char> *)&file_templatePS.m_count,(long)iVar4);
          _dwError = (undefined1 *)
                     CreateFileA(string,0x40000000,1,(LPSECURITY_ATTRIBUTES)0x0,1,0,(HANDLE)0x0);
          if (uUnique == 0) {
            while( true ) {
              DVar6 = GetLastError();
              bVar2 = false;
              if ((DVar6 != 3) && (bVar2 = false, _dwError == &DAT_ffffffffffffffff)) {
                bVar2 = local_f2 != 0xffff;
              }
              if (!bVar2) break;
              UVar3 = uUniqueSeed + 1;
              if ((USHORT)(uUniqueSeed + 1) == 0) {
                UVar3 = uUniqueSeed + 2;
              }
              uUniqueSeed = UVar3;
              CorUnix::CPalThread::SetLastError(0);
              SVar11 = StackString<32UL,_char>::GetSizeOf
                                 ((StackString<32UL,_char> *)&file_templatePS.m_count);
              sprintf_s(string,SVar11,_Dst,(ulong)uUniqueSeed);
              _dwError = (undefined1 *)
                         CreateFileA(string,0x40000000,1,(LPSECURITY_ATTRIBUTES)0x0,1,0,(HANDLE)0x0)
              ;
              local_f2 = local_f2 + 1;
            }
          }
          DVar6 = GetLastError();
          if (DVar6 == 0) {
            CorUnix::CPalThread::SetLastError(DVar5);
          }
          if (_dwError == &DAT_ffffffffffffffff) {
            if (local_f2 < 0xffff) {
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              DVar5 = GetLastError();
              if (DVar5 == 3) {
                CorUnix::CPalThread::SetLastError(0x10b);
              }
            }
            else {
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              CorUnix::CPalThread::SetLastError(0x50);
            }
            UStack_ec = 0;
          }
          else {
            UVar3 = uUniqueSeed;
            UStack_ec = uUnique;
            if (uUnique == 0) {
              UStack_ec = (UINT)uUniqueSeed;
              UVar3 = uUniqueSeed + 1;
              if ((USHORT)(uUniqueSeed + 1) == 0) {
                UVar3 = uUniqueSeed + 2;
              }
            }
            uUniqueSeed = UVar3;
            BVar7 = CloseHandle(_dwError);
            if (BVar7 == 0) {
              fprintf(_stderr,"] %s %s:%d","GetTempFileNameA",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                      ,0xe24);
              fprintf(_stderr,"Unable to close the handle %p\n",_dwError);
              CorUnix::CPalThread::SetLastError(0x54f);
              *lpTempFileName = '\0';
              UStack_ec = 0;
            }
            else {
              eVar8 = strcpy_s(lpTempFileName,0x400,string);
              if (eVar8 != 0) {
                if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                  abort();
                }
                CorUnix::CPalThread::SetLastError(0xce);
                *lpTempFileName = '\0';
                UStack_ec = 0;
              }
            }
          }
        }
      }
    }
    else {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      CorUnix::CPalThread::SetLastError(0xce);
    }
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&lpPathName_local);
  StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&file_templatePS.m_count);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return UStack_ec;
  }
  __stack_chk_fail();
}

Assistant:

UINT
PALAPI
GetTempFileNameA(
                 IN LPCSTR lpPathName,
                 IN LPCSTR lpPrefixString,
                 IN UINT   uUnique,
                 OUT LPSTR lpTempFileName)
{
    CPalThread *pThread;
    CHAR * full_name;
    PathCharString full_namePS;
    int length;
    CHAR * file_template;
    PathCharString file_templatePS;
    CHAR    chLastPathNameChar;
 
    HANDLE  hTempFile;
    UINT    uRet = 0;
    DWORD   dwError;
    USHORT  uLoopCounter = 0;

    PERF_ENTRY(GetTempFileNameA);
    ENTRY("GetTempFileNameA(lpPathName=%p (%s), lpPrefixString=%p (%s), uUnique=%u, " 
          "lpTempFileName=%p)\n",  lpPathName?lpPathName:"NULL",  lpPathName?lpPathName:"NULL", 
        lpPrefixString?lpPrefixString:"NULL", 
        lpPrefixString?lpPrefixString:"NULL", uUnique, 
        lpTempFileName?lpTempFileName:"NULL");

    pThread = InternalGetCurrentThread();
    if ( !IsInitialized )
    {
        uUniqueSeed = (USHORT)( time( NULL ) );
    
        /* On the off chance 0 is returned.
        0 being the error return code.  */
        ENSURE_UNIQUE_NOT_ZERO
        IsInitialized = TRUE;
    }

    if ( !lpPathName || *lpPathName == '\0' )
    {
       pThread->SetLastError( ERROR_DIRECTORY );
       goto done;
    }

    if ( NULL == lpTempFileName )  
    {
        ERROR( "lpTempFileName cannot be NULL\n" );
        pThread->SetLastError( ERROR_INVALID_PARAMETER );
        goto done;
    }

    if ( strlen( lpPathName ) + MAX_SEEDSIZE + MAX_PREFIX >= MAX_LONGPATH ) 
    {
        WARN( "File names larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH );
        pThread->SetLastError( ERROR_FILENAME_EXCED_RANGE );
        goto done;
    }

    length = strlen(lpPathName) + MAX_SEEDSIZE + MAX_PREFIX + 10;
    file_template = file_templatePS.OpenStringBuffer(length);
    if (NULL == file_template)
    {
        pThread->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto done;
    }
    *file_template = '\0';
    strcat_s( file_template, file_templatePS.GetSizeOf(), lpPathName );
    file_templatePS.CloseBuffer(length);

    chLastPathNameChar = file_template[strlen(file_template)-1];
    if (chLastPathNameChar != '\\' && chLastPathNameChar != '/')
    {
        strcat_s( file_template, file_templatePS.GetSizeOf(), "\\" );
    }
    
    if ( lpPrefixString )
    {
        strncat_s( file_template, file_templatePS.GetSizeOf(), lpPrefixString, MAX_PREFIX );
    }
    FILEDosToUnixPathA( file_template );
    strncat_s( file_template, file_templatePS.GetSizeOf(), "%.4x.TMP", MAX_SEEDSIZE );

    /* Create the file. */
    dwError = GetLastError();
    pThread->SetLastError( NOERROR );

    length = strlen(file_template) + MAX_SEEDSIZE + MAX_PREFIX;
    full_name = full_namePS.OpenStringBuffer(length);
    if (NULL == full_name)
    {
        pThread->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto done;
    }
    sprintf_s( full_name, full_namePS.GetSizeOf(), file_template, (0 == uUnique) ? uUniqueSeed : uUnique);
    full_namePS.CloseBuffer(length);
    
    hTempFile = CreateFileA( full_name, GENERIC_WRITE, 
                             FILE_SHARE_READ, NULL, CREATE_NEW, 0, NULL );
    
    if (uUnique == 0)
    {
        /* The USHORT will overflow back to 0 if we go past
        65536 files, so break the loop after 65536 iterations.
        If the CreateFile call was not successful within that 
        number of iterations, then there are no temp file names
        left for that directory. */
        while ( ERROR_PATH_NOT_FOUND != GetLastError() && 
                INVALID_HANDLE_VALUE == hTempFile && uLoopCounter < 0xFFFF )
        {
            uUniqueSeed++;
            ENSURE_UNIQUE_NOT_ZERO;

            pThread->SetLastError( NOERROR );
            sprintf_s( full_name, full_namePS.GetSizeOf(), file_template, uUniqueSeed );
            hTempFile = CreateFileA( full_name, GENERIC_WRITE, 
                                    FILE_SHARE_READ, NULL, CREATE_NEW, 0, NULL );
            uLoopCounter++;
        
        }
    }

    /* Reset the error code.*/
    if ( NOERROR == GetLastError() )
    {
        pThread->SetLastError( dwError );
    }

    /* Windows sets ERROR_FILE_EXISTS,if there
    are no available temp files. */
    if ( INVALID_HANDLE_VALUE != hTempFile )
    {
        if (0 == uUnique)
        {
            uRet = uUniqueSeed;
            uUniqueSeed++;
            ENSURE_UNIQUE_NOT_ZERO;
        }
        else
        {
            uRet = uUnique;
        }
        
        if ( CloseHandle( hTempFile ) )
        {
            if (strcpy_s( lpTempFileName, MAX_LONGPATH, full_name ) != SAFECRT_SUCCESS)
            {
                ERROR( "strcpy_s failed!\n");
                pThread->SetLastError( ERROR_FILENAME_EXCED_RANGE );
                *lpTempFileName = '\0';
                uRet = 0;
            }
        }
        else  
        {
            ASSERT( "Unable to close the handle %p\n", hTempFile );
            pThread->SetLastError( ERROR_INTERNAL_ERROR );
            *lpTempFileName = '\0';
            uRet = 0;
        }
    }
    else if ( INVALID_HANDLE_VALUE == hTempFile && uLoopCounter < 0xFFFF )
    {
        ERROR( "Unable to create temp file. \n" );
        uRet = 0;
        
        if ( ERROR_PATH_NOT_FOUND == GetLastError() )
        {
            /* CreateFile failed because it could not 
            find the path. */
            pThread->SetLastError( ERROR_DIRECTORY );
        } /* else use the lasterror value from CreateFileA */
    }
    else
    {
        TRACE( "65535 files already exist in the directory. "
               "No temp files available for creation.\n" );
        pThread->SetLastError( ERROR_FILE_EXISTS );
    }

done:
    LOGEXIT("GetTempFileNameA returns UINT %u\n", uRet);
    PERF_EXIT(GetTempFileNameA);
    return uRet;
       
}